

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmValue __thiscall cmMakefile::GetProperty(cmMakefile *this,string *prop)

{
  int iVar1;
  string *psVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  string_view separator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
    GetProperty();
  }
  iVar1 = std::__cxx11::string::compare((char *)prop);
  if (iVar1 == 0) {
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var3 = (this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(this->Tests)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      do {
        local_70._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,*(long *)(p_Var3 + 1),
                   (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_70._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_60) {
          operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var4);
    }
    separator._M_str = ";";
    separator._M_len = 1;
    cmJoin((string *)local_70,&local_48,separator,(string_view)ZEXT816(0));
    psVar2 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
               (string *)local_70);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_70._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_60) {
      operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  else {
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&this->StateSnapshot);
    psVar2 = (string *)cmStateDirectory::GetProperty((cmStateDirectory *)local_70,prop);
  }
  return (cmValue)psVar2;
}

Assistant:

cmValue cmMakefile::GetProperty(const std::string& prop) const
{
  // Check for computed properties.
  static std::string output;
  if (prop == "TESTS") {
    std::vector<std::string> keys;
    // get list of keys
    const auto* t = this;
    std::transform(
      t->Tests.begin(), t->Tests.end(), std::back_inserter(keys),
      [](decltype(t->Tests)::value_type const& pair) { return pair.first; });
    output = cmJoin(keys, ";");
    return cmValue(output);
  }

  return this->StateSnapshot.GetDirectory().GetProperty(prop);
}